

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgGeneratorState.hpp
# Opt level: O2

float rsg::SwizzleOp::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  float fVar1;
  
  fVar1 = 0.0;
  if ((((state->m_programParams->useSwizzle == true) &&
       (1 < (state->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish[-1])) &&
      ((valueRange.m_type)->m_baseType - TYPE_FLOAT < 3)) &&
     (2 < state->m_shaderParams->maxExpressionDepth - state->m_expressionDepth)) {
    fVar1 = 1.0;
  }
  return fVar1;
}

Assistant:

const ProgramParameters&	getProgramParameters		(void) const	{ return m_programParams;	}